

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

char * bssl::anon_unknown_0::GetVersionName(uint16_t version)

{
  char *pcStack_10;
  uint16_t version_local;
  
  if (version == 0x301) {
    pcStack_10 = "TLSv1";
  }
  else if (version == 0x302) {
    pcStack_10 = "TLSv1.1";
  }
  else if (version == 0x303) {
    pcStack_10 = "TLSv1.2";
  }
  else if (version == 0x304) {
    pcStack_10 = "TLSv1.3";
  }
  else if (version == 0xfefc) {
    pcStack_10 = "DTLSv1.3";
  }
  else if (version == 0xfefd) {
    pcStack_10 = "DTLSv1.2";
  }
  else if (version == 0xfeff) {
    pcStack_10 = "DTLSv1";
  }
  else {
    pcStack_10 = "???";
  }
  return pcStack_10;
}

Assistant:

static const char *GetVersionName(uint16_t version) {
  switch (version) {
    case TLS1_VERSION:
      return "TLSv1";
    case TLS1_1_VERSION:
      return "TLSv1.1";
    case TLS1_2_VERSION:
      return "TLSv1.2";
    case TLS1_3_VERSION:
      return "TLSv1.3";
    case DTLS1_VERSION:
      return "DTLSv1";
    case DTLS1_2_VERSION:
      return "DTLSv1.2";
    case DTLS1_3_VERSION:
      return "DTLSv1.3";
    default:
      return "???";
  }
}